

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::vprint(FILE *f,string_view format_str,format_args args)

{
  string_view text;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  basic_string_view<char> fmt;
  char *s;
  size_t count;
  unsigned_long_long in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R8;
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  basic_string_view<char> local_290;
  locale_ref local_280;
  unsigned_long_long local_278;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aStack_270;
  char *local_268;
  size_t sStack_260;
  allocator<char> local_241;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_240;
  size_t local_28;
  unsigned_long_long local_20;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aStack_18;
  char *local_10;
  size_t sStack_8;
  
  local_28 = in_RDI;
  local_20 = in_RCX;
  aStack_18 = in_R8;
  local_10 = in_RSI;
  sStack_8 = in_RDX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (&local_240,&local_241);
  std::allocator<char>::~allocator(&local_241);
  local_268 = local_10;
  sStack_260 = sStack_8;
  local_278 = local_20;
  aStack_270 = aStack_18;
  detail::locale_ref::locale_ref(&local_280);
  fmt.size_ = sStack_260;
  fmt.data_ = local_268;
  args_00.field_1.args_ = aStack_270.args_;
  args_00.desc_ = local_278;
  detail::vformat_to<char>(&local_240.super_buffer<char>,fmt,args_00,local_280);
  this = &local_240;
  s = detail::buffer<char>::data(&this->super_buffer<char>);
  count = detail::buffer<char>::size(&this->super_buffer<char>);
  basic_string_view<char>::basic_string_view(&local_290,s,count);
  text.size_ = local_28;
  text.data_ = s;
  detail::print((FILE *)this,text);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_240);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::print(f, {buffer.data(), buffer.size()});
}